

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O3

int __thiscall
ncnn::Convolution_x86::forward_int8_x86
          (Convolution_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  ulong uVar1;
  undefined8 uVar2;
  undefined1 uVar3;
  undefined1 uVar5;
  undefined1 uVar7;
  undefined4 uVar4;
  undefined1 uVar9;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  undefined1 uVar16;
  undefined1 uVar17;
  undefined1 uVar18;
  undefined1 uVar22;
  undefined1 uVar23;
  undefined1 uVar24;
  undefined1 uVar28;
  undefined1 uVar29;
  undefined1 uVar30;
  _func_int *p_Var31;
  Layer *pLVar32;
  int *piVar33;
  undefined1 auVar34 [14];
  undefined1 auVar35 [12];
  unkbyte10 Var36;
  undefined1 auVar37 [14];
  undefined1 auVar38 [12];
  unkbyte10 Var39;
  undefined1 auVar40 [14];
  undefined1 auVar41 [12];
  unkbyte10 Var42;
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar47 [14];
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  undefined1 auVar50 [14];
  undefined1 auVar51 [12];
  undefined1 auVar52 [14];
  undefined1 auVar53 [12];
  undefined1 auVar54 [12];
  unkbyte10 Var55;
  int iVar56;
  int iVar57;
  int iVar58;
  int i;
  uint uVar59;
  int iVar60;
  int iVar61;
  ulong uVar62;
  int iVar63;
  int iVar64;
  int iVar65;
  ulong uVar66;
  pointer piVar67;
  undefined1 *puVar68;
  pointer piVar69;
  long lVar70;
  int outw;
  uint uVar71;
  uint uVar72;
  undefined1 *puVar73;
  void *pvVar74;
  long lVar75;
  long lVar76;
  undefined8 *puVar77;
  uint uVar78;
  int i_1;
  int i_3;
  int iVar80;
  long lVar81;
  int iVar82;
  int outw_1;
  ulong uVar83;
  Convolution_x86 *pCVar84;
  void *pvVar85;
  int iVar86;
  ulong uVar87;
  char cVar96;
  char cVar97;
  char cVar98;
  char cVar99;
  char cVar100;
  char cVar101;
  undefined1 auVar88 [16];
  int iVar102;
  int iVar113;
  int iVar114;
  int iVar115;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar112 [16];
  int iVar116;
  short sVar129;
  undefined1 auVar117 [12];
  int iVar128;
  int iVar130;
  int iVar131;
  undefined1 auVar118 [16];
  undefined1 auVar126 [16];
  int iVar133;
  int iVar134;
  undefined1 auVar132 [16];
  int iVar135;
  undefined4 uVar136;
  short sVar142;
  undefined1 auVar149 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  short sVar176;
  int iVar173;
  short sVar177;
  short sVar178;
  short sVar179;
  short sVar180;
  short sVar181;
  int iVar182;
  short sVar185;
  short sVar188;
  undefined1 auVar186 [12];
  short sVar191;
  undefined1 auVar189 [12];
  int w_1;
  int w;
  Option opt_q;
  void *local_1e8;
  allocator_type local_1d9;
  void *local_1d8;
  pointer local_1d0;
  void *local_1c8;
  Mat *local_1c0;
  pointer local_1b8;
  void *local_1b0;
  Convolution_x86 *local_1a8;
  ulong local_1a0;
  undefined1 *local_198;
  Mat *local_190;
  long local_188;
  Option *local_180;
  Mat local_178;
  void *local_130;
  undefined1 local_128 [64];
  size_t local_e8;
  Mat *local_e0;
  Mat local_d8;
  Mat *local_88;
  int local_80;
  int local_7c;
  Mat local_78;
  undefined7 uVar6;
  undefined6 uVar8;
  undefined5 uVar10;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined3 uVar19;
  undefined3 uVar20;
  undefined3 uVar21;
  undefined2 uVar25;
  undefined2 uVar26;
  undefined2 uVar27;
  undefined1 *puVar79;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar127 [16];
  undefined6 uVar137;
  undefined8 uVar138;
  undefined1 auVar139 [12];
  undefined1 auVar140 [14];
  undefined1 auVar141 [16];
  undefined4 uVar143;
  undefined6 uVar144;
  undefined8 uVar145;
  undefined1 auVar146 [12];
  undefined1 auVar147 [14];
  undefined1 auVar148 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar174 [12];
  undefined1 auVar175 [16];
  undefined1 auVar183 [12];
  undefined1 auVar184 [16];
  undefined1 auVar187 [16];
  undefined1 auVar190 [16];
  
  local_78.elempack = bottom_blob->elempack;
  local_78.elemsize = bottom_blob->elemsize;
  local_78.data = bottom_blob->data;
  local_78.refcount = bottom_blob->refcount;
  local_78.allocator = bottom_blob->allocator;
  local_78.dims = bottom_blob->dims;
  local_78.w = bottom_blob->w;
  local_78.h = bottom_blob->h;
  local_78.d = bottom_blob->d;
  local_78.c = bottom_blob->c;
  local_78.cstep = bottom_blob->cstep;
  if (local_78.refcount != (int *)0x0) {
    LOCK();
    *local_78.refcount = *local_78.refcount + 1;
    UNLOCK();
  }
  if (local_78.elempack == 0 || ((int)local_78.elemsize * 8) / local_78.elempack != 8) {
    local_128._0_8_ = *(undefined8 *)opt;
    uVar2 = opt->workspace_allocator;
    uVar4 = opt->openmp_blocktime;
    uVar11 = opt->use_winograd_convolution;
    uVar16 = opt->use_sgemm_convolution;
    uVar22 = opt->use_int8_inference;
    uVar28 = opt->use_vulkan_compute;
    uVar25 = CONCAT11(uVar28,uVar22);
    uVar19 = CONCAT21(uVar25,uVar16);
    uVar14 = CONCAT31(uVar19,uVar11);
    auVar112[0] = opt->use_bf16_storage;
    auVar112[1] = opt->use_fp16_packed;
    auVar112[2] = opt->use_fp16_storage;
    auVar112[3] = opt->use_fp16_arithmetic;
    auVar112[4] = opt->use_int8_packed;
    auVar112[5] = opt->use_int8_storage;
    auVar112[6] = opt->use_int8_arithmetic;
    auVar112[7] = opt->use_packing_layout;
    uVar3 = opt->use_shader_pack8;
    uVar5 = opt->use_subgroup_basic;
    uVar7 = opt->use_subgroup_vote;
    uVar9 = opt->use_subgroup_ballot;
    uVar12 = opt->use_subgroup_shuffle;
    uVar17 = opt->use_image_storage;
    uVar23 = opt->use_tensor_storage;
    uVar29 = opt->use_reserved_0;
    uVar26 = CONCAT11(uVar29,uVar23);
    uVar20 = CONCAT21(uVar26,uVar17);
    uVar15 = CONCAT31(uVar20,uVar12);
    uVar10 = CONCAT41(uVar15,uVar9);
    uVar8 = CONCAT51(uVar10,uVar7);
    uVar6 = CONCAT61(uVar8,uVar5);
    auVar112._8_8_ = CONCAT71(uVar6,uVar3);
    auVar126._0_4_ = opt->flush_denormals;
    auVar126[4] = opt->use_local_pool_allocator;
    auVar126[5] = opt->use_shader_local_memory;
    auVar126[6] = opt->use_cooperative_matrix;
    auVar126[7] = opt->use_winograd23_convolution;
    auVar126[8] = opt->use_winograd43_convolution;
    auVar126[9] = opt->use_winograd63_convolution;
    auVar126[10] = opt->use_a53_a55_optimized_kernel;
    auVar126[0xb] = opt->use_reserved_7;
    uVar13 = opt->use_reserved_8;
    uVar18 = opt->use_reserved_9;
    uVar24 = opt->use_reserved_10;
    uVar30 = opt->use_reserved_11;
    uVar27 = CONCAT11(uVar30,uVar24);
    uVar21 = CONCAT21(uVar27,uVar18);
    auVar126._12_4_ = CONCAT31(uVar21,uVar13);
    local_128._48_12_ = auVar126._0_12_;
    local_128._32_8_ = auVar112._0_8_;
    local_128._40_4_ = (undefined4)auVar112._8_8_;
    local_128._8_4_ = SUB84(opt->workspace_allocator,0);
    local_128._12_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    local_128._16_8_ = uVar2;
    local_128._24_4_ = uVar4;
    local_128._28_4_ = uVar14;
    local_128._44_4_ = uVar15;
    local_128._60_4_ = auVar126._12_4_;
    quantize_to_int8(bottom_blob,&local_78,
                     (Mat *)(&this->field_0x238 + (long)this->_vptr_Convolution_x86[-3]),
                     (Option *)local_128);
  }
  local_178.cstep = 0;
  local_178.data = (void *)0x0;
  local_178.refcount._0_4_ = 0;
  local_178.refcount._4_4_ = 0;
  local_178.elemsize = 0;
  local_178.elempack = 0;
  local_178.allocator = (Allocator *)0x0;
  local_178.dims = 0;
  local_178.w = 0;
  local_178.h = 0;
  local_178.d = 0;
  local_178.c = 0;
  local_1a8 = this;
  Convolution::make_padding
            ((Convolution *)
             ((long)&this->_vptr_Convolution_x86 + (long)this->_vptr_Convolution_x86[-3]),&local_78,
             &local_178,opt);
  iVar60 = -100;
  if ((local_178.data == (void *)0x0) || (local_178.cstep * (long)local_178.c == 0))
  goto LAB_001b4178;
  p_Var31 = local_1a8->_vptr_Convolution_x86[-3];
  uVar71 = *(uint *)(p_Var31 + 0x28 + (long)&(local_1a8->weight_winograd23_data).data);
  iVar82 = (~((*(int *)(p_Var31 + 0x2c + (long)&(local_1a8->weight_winograd23_data).data) + -1) *
             *(int *)(p_Var31 + 0x34 + (long)&(local_1a8->weight_winograd23_data).data)) +
           local_178.w) / *(int *)(p_Var31 + 0x3c + (long)&(local_1a8->weight_winograd23_data).data)
           + 1;
  iVar80 = (~((*(int *)(p_Var31 + 0x30 + (long)&(local_1a8->weight_winograd23_data).data) + -1) *
             *(int *)(p_Var31 + 0x38 + (long)&(local_1a8->weight_winograd23_data).data)) +
           local_178.h) / *(int *)(p_Var31 + 0x40 + (long)&(local_1a8->weight_winograd23_data).data)
           + 1;
  iVar63 = *(int *)(p_Var31 + 0x18 + (long)&(local_1a8->weight_winograd43_data).data);
  uVar72 = 1;
  if (opt->use_packing_layout == true) {
    if (iVar63 < 0x65) {
      uVar72 = (uint)((uVar71 & 3) == 0) * 3 + 1;
    }
    else {
      uVar72 = 1;
      if ((uVar71 & 7) == 0) {
        uVar72 = 8;
      }
    }
  }
  local_1a0 = CONCAT44(local_1a0._4_4_,local_178.elempack);
  uVar59 = uVar72 * 4;
  if (100 < iVar63) {
    uVar59 = uVar72;
  }
  local_188 = (long)local_178.c;
  Mat::create(top_blob,iVar82,iVar80,(int)uVar71 / (int)uVar72,(ulong)uVar59,uVar72,
              opt->blob_allocator);
  if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
  goto LAB_001b4178;
  local_190 = (Mat *)0x1;
  if (opt->use_packing_layout == true) {
    local_190 = (Mat *)(ulong)((uint)(((byte)(local_1a8->_vptr_Convolution_x86[-3] + 0x28)
                                             [(long)&(local_1a8->weight_winograd23_data).data] & 3)
                                     == 0) * 3 + 1);
  }
  local_d8.cstep = 0;
  local_d8.data = (void *)0x0;
  local_d8.refcount._0_4_ = 0;
  local_d8.refcount._4_4_ = 0;
  local_d8.elemsize = 0;
  local_d8.elempack = 0;
  local_d8.allocator = (Allocator *)0x0;
  local_d8.dims = 0;
  local_d8.w = 0;
  local_d8.h = 0;
  local_d8.d = 0;
  local_d8.c = 0;
  iVar60 = (int)local_190;
  local_180 = opt;
  local_88 = top_blob;
  local_7c = iVar63;
  Mat::create(&local_d8,iVar82,iVar80,
              *(int *)(local_1a8->_vptr_Convolution_x86[-3] + 0x28 +
                      (long)&(local_1a8->weight_winograd23_data).data) / iVar60,
              (ulong)(uint)(iVar60 * 4),iVar60,opt->workspace_allocator);
  iVar82 = local_d8.h;
  iVar80 = local_d8.w;
  iVar63 = local_178.c;
  iVar60 = -100;
  if ((local_d8.data != (void *)0x0) &&
     (local_1c0 = (Mat *)(long)local_d8.c, local_d8.cstep * (long)local_1c0 != 0)) {
    iVar60 = (int)local_190;
    pCVar84 = local_1a8;
    iVar86 = (int)local_1a0;
    if (((int)local_1a0 == 8) && (iVar60 == 4)) {
      p_Var31 = local_1a8->_vptr_Convolution_x86[-3];
      uVar71 = *(uint *)(p_Var31 + 0x2c + (long)&(local_1a8->weight_winograd23_data).data);
      if (((ulong)uVar71 == 1) &&
         (*(int *)(p_Var31 + 0x30 + (long)&(local_1a8->weight_winograd23_data).data) == 1)) {
        if ((*(int *)(p_Var31 + 0x34 + (long)&(local_1a8->weight_winograd23_data).data) == 1) &&
           (((*(int *)(p_Var31 + 0x38 + (long)&(local_1a8->weight_winograd23_data).data) == 1 &&
             (*(int *)(p_Var31 + 0x3c + (long)&(local_1a8->weight_winograd23_data).data) == 1)) &&
            (*(int *)(p_Var31 + 0x40 + (long)&(local_1a8->weight_winograd23_data).data) == 1)))) {
          conv1x1s1_sgemm_pack8to4_int8_sse
                    (&local_178,&local_d8,&local_1a8->weight_sgemm_data,local_180);
        }
        else {
          if (((*(int *)(p_Var31 + 0x34 + (long)&(local_1a8->weight_winograd23_data).data) != 1) ||
              (*(int *)(p_Var31 + 0x38 + (long)&(local_1a8->weight_winograd23_data).data) != 1)) ||
             ((*(int *)(p_Var31 + 0x3c + (long)&(local_1a8->weight_winograd23_data).data) != 2 ||
              (*(int *)(p_Var31 + 0x40 + (long)&(local_1a8->weight_winograd23_data).data) != 2))))
          goto LAB_001b262e;
          conv1x1s2_sgemm_pack8to4_int8_sse
                    (&local_178,&local_d8,&local_1a8->weight_sgemm_data,local_180);
        }
      }
      else {
LAB_001b262e:
        if ((((local_180->use_winograd_convolution != true) || (uVar71 != 3)) ||
            (local_180->use_winograd43_convolution == false)) ||
           ((((*(int *)(p_Var31 + 0x30 + (long)&(local_1a8->weight_winograd23_data).data) != 3 ||
              (*(int *)(p_Var31 + 0x34 + (long)&(local_1a8->weight_winograd23_data).data) != 1)) ||
             (*(int *)(p_Var31 + 0x38 + (long)&(local_1a8->weight_winograd23_data).data) != 1)) ||
            ((*(int *)(p_Var31 + 0x3c + (long)&(local_1a8->weight_winograd23_data).data) != 1 ||
             (*(int *)(p_Var31 + 0x40 + (long)&(local_1a8->weight_winograd23_data).data) != 1))))))
        {
          uVar72 = *(uint *)(p_Var31 + 0x30 + (long)&(local_1a8->weight_winograd23_data).data);
          local_198 = (undefined1 *)
                      (long)*(int *)(p_Var31 + 0x34 +
                                    (long)&(local_1a8->weight_winograd23_data).data);
          local_1c8 = (void *)(long)*(int *)(p_Var31 + 0x38 +
                                            (long)&(local_1a8->weight_winograd23_data).data);
          iVar60 = *(int *)(p_Var31 + 0x3c + (long)&(local_1a8->weight_winograd23_data).data);
          local_1b8 = (pointer)(long)*(int *)(p_Var31 + 0x40 +
                                             (long)&(local_1a8->weight_winograd23_data).data);
          local_1d0 = (pointer)CONCAT44(local_1d0._4_4_,local_178.w);
          uVar62 = (ulong)(uint)local_178.c;
          puVar73 = (undefined1 *)(ulong)(uint)local_d8.w;
          uVar83 = (ulong)(uint)local_d8.h;
          if (local_180->use_sgemm_convolution == true) {
            local_e8 = 0;
            local_128._0_8_ = (pointer)0x0;
            local_128._8_4_ = 0;
            local_128._12_4_ = 0;
            local_128._16_8_ = (Allocator *)0x0;
            local_128._24_4_ = 0;
            local_128._32_8_ = (Allocator *)0x0;
            local_128._40_4_ = 0;
            local_128._44_4_ = 0;
            local_128._48_12_ = SUB1612((undefined1  [16])0x0,4);
            Mat::create((Mat *)local_128,local_d8.h * local_d8.w,uVar71 * uVar72,local_178.c,8,8,
                        local_180->workspace_allocator);
            local_1c0 = &local_1a8->weight_sgemm_data;
            if (0 < iVar63) {
              iVar63 = (int)local_1d0 * (int)local_1b8;
              local_1b0 = local_178.data;
              local_1b8 = (pointer)local_128._0_8_;
              local_1d8 = (void *)((long)local_178.w * (long)local_1c8);
              local_1e8 = (void *)0x0;
              do {
                if (0 < (int)uVar72) {
                  local_1d0 = (pointer)((long)local_178.data +
                                       local_178.cstep * (long)local_1e8 * local_178.elemsize);
                  piVar67 = (pointer)(local_128._0_8_ +
                                     local_e8 * (long)local_1e8 * local_128._16_8_);
                  local_1c8 = (void *)(local_178.elemsize * (long)local_1d8);
                  uVar83 = 0;
                  do {
                    if (0 < (int)uVar71) {
                      uVar66 = 0;
                      do {
                        if (0 < iVar82) {
                          puVar77 = (undefined8 *)
                                    ((long)local_1d0 +
                                    uVar66 * (long)local_198 * 8 + (long)local_1c8 * uVar83);
                          uVar59 = 0;
                          do {
                            puVar79 = puVar73;
                            if (0 < iVar80) {
                              do {
                                *(undefined8 *)piVar67 = *puVar77;
                                piVar67 = piVar67 + 2;
                                puVar77 = puVar77 + iVar60;
                                uVar78 = (int)puVar79 - 1;
                                puVar79 = (undefined1 *)(ulong)uVar78;
                              } while (uVar78 != 0);
                            }
                            puVar77 = puVar77 + (iVar63 - iVar80 * iVar60);
                            uVar59 = uVar59 + 1;
                          } while (uVar59 != iVar82);
                        }
                        uVar66 = uVar66 + 1;
                      } while (uVar66 != uVar71);
                    }
                    uVar83 = uVar83 + 1;
                  } while (uVar83 != uVar72);
                }
                local_1e8 = (void *)((long)local_1e8 + 1);
              } while (local_1e8 != (void *)uVar62);
            }
            im2col_sgemm_pack8to4_int8_sse((Mat *)local_128,&local_d8,local_1c0,local_180);
            pCVar84 = local_1a8;
            piVar33 = (int *)CONCAT44(local_128._12_4_,local_128._8_4_);
            iVar86 = (int)local_1a0;
            iVar60 = (int)local_190;
            if (piVar33 != (int *)0x0) {
              LOCK();
              *piVar33 = *piVar33 + -1;
              UNLOCK();
              if (*piVar33 == 0) {
                if ((Allocator *)local_128._32_8_ == (Allocator *)0x0) {
                  if ((pointer)local_128._0_8_ != (pointer)0x0) {
                    free((void *)local_128._0_8_);
                  }
                }
                else {
                  (*(*(_func_int ***)local_128._32_8_)[3])();
                }
              }
            }
          }
          else {
            uVar59 = uVar71 * uVar72;
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)local_128,(long)(int)uVar59,&local_1d9);
            pCVar84 = local_1a8;
            if (0 < (int)uVar72) {
              iVar86 = 0;
              iVar61 = 0;
              uVar78 = 0;
              do {
                if (0 < (int)uVar71) {
                  lVar70 = 0;
                  do {
                    *(int *)(local_128._0_8_ + (iVar86 + lVar70) * 4) = iVar61;
                    iVar61 = iVar61 + (int)local_198;
                    lVar70 = lVar70 + 1;
                  } while (uVar71 != (uint)lVar70);
                  iVar86 = iVar86 + (uint)lVar70;
                }
                iVar61 = iVar61 + ((int)local_1d0 * (int)local_1c8 - (int)local_198 * uVar71);
                uVar78 = uVar78 + 1;
              } while (uVar78 != uVar72);
            }
            if (0 < (int)local_1c0) {
              local_1b0 = (void *)((long)iVar80 * 4);
              local_1e8 = (void *)0x0;
              do {
                if (0 < iVar82) {
                  local_1d0 = (pointer)(local_d8.cstep * (long)local_1e8 * local_d8.elemsize +
                                       (long)local_d8.data);
                  local_1d8 = (void *)0x0;
                  do {
                    if (0 < iVar80) {
                      local_1c8 = (void *)((long)local_1d8 * (long)local_1b8);
                      puVar79 = (undefined1 *)0x0;
                      do {
                        local_198 = puVar79;
                        if (iVar63 < 1) {
                          iVar116 = 0;
                          iVar128 = 0;
                          iVar130 = 0;
                          iVar131 = 0;
                          iVar102 = 0;
                          iVar113 = 0;
                          iVar114 = 0;
                          iVar115 = 0;
                          auVar132 = (undefined1  [16])0x0;
                          iVar86 = 0;
                          iVar61 = 0;
                          iVar64 = 0;
                          iVar65 = 0;
                        }
                        else {
                          pvVar74 = (void *)((local_1a8->weight_data_tm).cstep * (long)local_1e8 *
                                             (local_1a8->weight_data_tm).elemsize +
                                            (long)(local_1a8->weight_data_tm).data);
                          iVar86 = 0;
                          iVar61 = 0;
                          iVar64 = 0;
                          iVar65 = 0;
                          uVar66 = 0;
                          auVar132 = (undefined1  [16])0x0;
                          iVar102 = 0;
                          iVar113 = 0;
                          iVar114 = 0;
                          iVar115 = 0;
                          iVar116 = 0;
                          iVar128 = 0;
                          iVar130 = 0;
                          iVar131 = 0;
                          do {
                            if (0 < (int)uVar59) {
                              lVar70 = 0;
                              do {
                                uVar87 = *(ulong *)((long)local_178.data +
                                                   (long)*(int *)(local_128._0_8_ + lVar70) * 8 +
                                                   local_178.cstep * local_178.elemsize * uVar66 +
                                                   (long)(iVar60 * 8 * (int)local_198) +
                                                   (long)local_178.w * (long)local_1c8 *
                                                   local_178.elemsize);
                                cVar96 = (char)(uVar87 >> 8);
                                cVar97 = (char)(uVar87 >> 0x10);
                                cVar98 = (char)(uVar87 >> 0x18);
                                cVar99 = (char)(uVar87 >> 0x20);
                                cVar100 = (char)(uVar87 >> 0x28);
                                cVar101 = (char)(uVar87 >> 0x30);
                                auVar172._8_6_ = 0;
                                auVar172._0_8_ = uVar87;
                                auVar172[0xe] = (char)(uVar87 >> 0x38);
                                auVar172[0xf] = -((long)uVar87 < 0);
                                auVar171._14_2_ = auVar172._14_2_;
                                auVar171._8_5_ = 0;
                                auVar171._0_8_ = uVar87;
                                auVar171[0xd] = -(cVar101 < '\0');
                                auVar170._13_3_ = auVar171._13_3_;
                                auVar170._8_4_ = 0;
                                auVar170._0_8_ = uVar87;
                                auVar170[0xc] = cVar101;
                                auVar169._12_4_ = auVar170._12_4_;
                                auVar169._8_3_ = 0;
                                auVar169._0_8_ = uVar87;
                                auVar169[0xb] = -(cVar100 < '\0');
                                auVar168._11_5_ = auVar169._11_5_;
                                auVar168._8_2_ = 0;
                                auVar168._0_8_ = uVar87;
                                auVar168[10] = cVar100;
                                auVar167._10_6_ = auVar168._10_6_;
                                auVar167[8] = 0;
                                auVar167._0_8_ = uVar87;
                                auVar167[9] = -(cVar99 < '\0');
                                auVar166._9_7_ = auVar167._9_7_;
                                auVar166[8] = cVar99;
                                auVar166._0_8_ = uVar87;
                                Var36 = CONCAT91(CONCAT81(auVar166._8_8_,-(cVar98 < '\0')),cVar98);
                                auVar35._2_10_ = Var36;
                                auVar35[1] = -(cVar97 < '\0');
                                auVar35[0] = cVar97;
                                auVar34._2_12_ = auVar35;
                                auVar34[1] = -(cVar96 < '\0');
                                auVar34[0] = cVar96;
                                auVar165._0_2_ = CONCAT11(-((char)uVar87 < '\0'),(char)uVar87);
                                auVar165._2_14_ = auVar34;
                                auVar112 = *(undefined1 (*) [16])((long)pvVar74 + lVar70 * 8);
                                auVar126 = *(undefined1 (*) [16])((long)pvVar74 + lVar70 * 8 + 0x10)
                                ;
                                auVar163._0_14_ = auVar112._0_14_;
                                auVar163[0xe] = auVar112[7];
                                auVar163[0xf] = -(auVar112[7] < '\0');
                                auVar162._14_2_ = auVar163._14_2_;
                                auVar162._0_13_ = auVar112._0_13_;
                                auVar162[0xd] = -(auVar112[6] < '\0');
                                auVar161._13_3_ = auVar162._13_3_;
                                auVar161._0_12_ = auVar112._0_12_;
                                auVar161[0xc] = auVar112[6];
                                auVar160._12_4_ = auVar161._12_4_;
                                auVar160._0_11_ = auVar112._0_11_;
                                auVar160[0xb] = -(auVar112[5] < '\0');
                                auVar159._11_5_ = auVar160._11_5_;
                                auVar159._0_10_ = auVar112._0_10_;
                                auVar159[10] = auVar112[5];
                                auVar158._10_6_ = auVar159._10_6_;
                                auVar158._0_9_ = auVar112._0_9_;
                                auVar158[9] = -(auVar112[4] < '\0');
                                auVar157._9_7_ = auVar158._9_7_;
                                auVar157._0_8_ = auVar112._0_8_;
                                auVar157[8] = auVar112[4];
                                Var39 = CONCAT91(CONCAT81(auVar157._8_8_,-(auVar112[3] < '\0')),
                                                 auVar112[3]);
                                auVar38._2_10_ = Var39;
                                auVar38[1] = -(auVar112[2] < '\0');
                                auVar38[0] = auVar112[2];
                                auVar37._2_12_ = auVar38;
                                auVar37[1] = -(auVar112[1] < '\0');
                                auVar37[0] = auVar112[1];
                                auVar156._0_2_ = CONCAT11(-(auVar112[0] < '\0'),auVar112[0]);
                                auVar156._2_14_ = auVar37;
                                sVar142 = CONCAT11(-(auVar112[8] < '\0'),auVar112[8]);
                                uVar143 = CONCAT13(-(auVar112[9] < '\0'),
                                                   CONCAT12(auVar112[9],sVar142));
                                uVar144 = CONCAT15(-(auVar112[10] < '\0'),
                                                   CONCAT14(auVar112[10],uVar143));
                                uVar145 = CONCAT17(-(auVar112[0xb] < '\0'),
                                                   CONCAT16(auVar112[0xb],uVar144));
                                auVar146._0_10_ =
                                     CONCAT19(-(auVar112[0xc] < '\0'),
                                              CONCAT18(auVar112[0xc],uVar145));
                                auVar146[10] = auVar112[0xd];
                                auVar146[0xb] = -(auVar112[0xd] < '\0');
                                auVar147[0xc] = auVar112[0xe];
                                auVar147._0_12_ = auVar146;
                                auVar147[0xd] = -(auVar112[0xe] < '\0');
                                auVar148[0xe] = auVar112[0xf];
                                auVar148._0_14_ = auVar147;
                                auVar148[0xf] = -(auVar112[0xf] < '\0');
                                auVar154._0_14_ = auVar126._0_14_;
                                auVar154[0xe] = auVar126[7];
                                auVar154[0xf] = -(auVar126[7] < '\0');
                                auVar153._14_2_ = auVar154._14_2_;
                                auVar153._0_13_ = auVar126._0_13_;
                                auVar153[0xd] = -(auVar126[6] < '\0');
                                auVar152._13_3_ = auVar153._13_3_;
                                auVar152._0_12_ = auVar126._0_12_;
                                auVar152[0xc] = auVar126[6];
                                auVar164._12_4_ = auVar152._12_4_;
                                auVar164._0_11_ = auVar126._0_11_;
                                auVar164[0xb] = -(auVar126[5] < '\0');
                                auVar151._11_5_ = auVar164._11_5_;
                                auVar151._0_10_ = auVar126._0_10_;
                                auVar151[10] = auVar126[5];
                                auVar155._10_6_ = auVar151._10_6_;
                                auVar155._0_9_ = auVar126._0_9_;
                                auVar155[9] = -(auVar126[4] < '\0');
                                auVar150._9_7_ = auVar155._9_7_;
                                auVar150._0_8_ = auVar126._0_8_;
                                auVar150[8] = auVar126[4];
                                Var42 = CONCAT91(CONCAT81(auVar150._8_8_,-(auVar126[3] < '\0')),
                                                 auVar126[3]);
                                auVar41._2_10_ = Var42;
                                auVar41[1] = -(auVar126[2] < '\0');
                                auVar41[0] = auVar126[2];
                                auVar40._2_12_ = auVar41;
                                auVar40[1] = -(auVar126[1] < '\0');
                                auVar40[0] = auVar126[1];
                                auVar149._0_2_ = CONCAT11(-(auVar126[0] < '\0'),auVar126[0]);
                                auVar149._2_14_ = auVar40;
                                sVar129 = CONCAT11(-(auVar126[8] < '\0'),auVar126[8]);
                                uVar136 = CONCAT13(-(auVar126[9] < '\0'),
                                                   CONCAT12(auVar126[9],sVar129));
                                uVar137 = CONCAT15(-(auVar126[10] < '\0'),
                                                   CONCAT14(auVar126[10],uVar136));
                                uVar138 = CONCAT17(-(auVar126[0xb] < '\0'),
                                                   CONCAT16(auVar126[0xb],uVar137));
                                auVar139._0_10_ =
                                     CONCAT19(-(auVar126[0xc] < '\0'),
                                              CONCAT18(auVar126[0xc],uVar138));
                                auVar139[10] = auVar126[0xd];
                                auVar139[0xb] = -(auVar126[0xd] < '\0');
                                auVar140[0xc] = auVar126[0xe];
                                auVar140._0_12_ = auVar139;
                                auVar140[0xd] = -(auVar126[0xe] < '\0');
                                auVar141[0xe] = auVar126[0xf];
                                auVar141._0_14_ = auVar140;
                                auVar141[0xf] = -(auVar126[0xf] < '\0');
                                sVar176 = auVar34._0_2_;
                                sVar177 = auVar35._0_2_;
                                sVar191 = (short)Var36;
                                sVar178 = sVar191 * (short)Var39;
                                sVar179 = auVar166._8_2_;
                                sVar180 = auVar168._10_2_;
                                sVar181 = auVar170._12_2_;
                                auVar164 = pmulhw(auVar156,auVar165);
                                sVar185 = sVar191 * (short)((ulong)uVar145 >> 0x30);
                                auVar126 = pmulhw(auVar148,auVar165);
                                sVar188 = sVar191 * (short)Var42;
                                auVar155 = pmulhw(auVar149,auVar165);
                                sVar191 = sVar191 * (short)((ulong)uVar138 >> 0x30);
                                auVar112 = pmulhw(auVar141,auVar165);
                                iVar182 = CONCAT22(auVar164._6_2_,sVar178);
                                Var36 = CONCAT64(CONCAT42(iVar182,auVar164._4_2_),
                                                 CONCAT22(sVar177 * auVar38._0_2_,sVar178));
                                auVar43._4_8_ = (long)((unkuint10)Var36 >> 0x10);
                                auVar43._2_2_ = auVar164._2_2_;
                                auVar43._0_2_ = sVar176 * auVar37._0_2_;
                                iVar56 = CONCAT22(auVar126._6_2_,sVar185);
                                Var39 = CONCAT64(CONCAT42(iVar56,auVar126._4_2_),
                                                 CONCAT22(sVar177 * (short)((uint6)uVar144 >> 0x20),
                                                          sVar185));
                                auVar44._4_8_ = (long)((unkuint10)Var39 >> 0x10);
                                auVar44._2_2_ = auVar126._2_2_;
                                auVar44._0_2_ = sVar176 * (short)((uint)uVar143 >> 0x10);
                                iVar133 = auVar132._4_4_;
                                iVar134 = auVar132._8_4_;
                                iVar135 = auVar132._12_4_;
                                iVar57 = CONCAT22(auVar155._6_2_,sVar188);
                                Var42 = CONCAT64(CONCAT42(iVar57,auVar155._4_2_),
                                                 CONCAT22(sVar177 * auVar41._0_2_,sVar188));
                                auVar45._4_8_ = (long)((unkuint10)Var42 >> 0x10);
                                auVar45._2_2_ = auVar155._2_2_;
                                auVar45._0_2_ = sVar176 * auVar40._0_2_;
                                iVar58 = CONCAT22(auVar112._6_2_,sVar191);
                                Var55 = CONCAT64(CONCAT42(iVar58,auVar112._4_2_),
                                                 CONCAT22(sVar177 * (short)((uint6)uVar137 >> 0x20),
                                                          sVar191));
                                auVar46._4_8_ = (long)((unkuint10)Var55 >> 0x10);
                                auVar46._2_2_ = auVar112._2_2_;
                                auVar46._0_2_ = sVar176 * (short)((uint)uVar136 >> 0x10);
                                iVar173 = CONCAT22(auVar164._8_2_,sVar179 * auVar157._8_2_);
                                auVar174._0_8_ =
                                     CONCAT26(auVar164._10_2_,
                                              CONCAT24(sVar180 * auVar159._10_2_,iVar173));
                                auVar174._8_2_ = sVar181 * auVar161._12_2_;
                                auVar174._10_2_ = auVar164._12_2_;
                                auVar175._12_2_ = auVar171._14_2_ * auVar162._14_2_;
                                auVar175._0_12_ = auVar174;
                                auVar175._14_2_ = auVar164._14_2_;
                                iVar86 = iVar173 + CONCAT22(auVar164._0_2_,
                                                            auVar165._0_2_ * auVar156._0_2_) +
                                                   iVar86;
                                iVar61 = (int)((ulong)auVar174._0_8_ >> 0x20) +
                                         auVar43._0_4_ + iVar61;
                                iVar64 = auVar174._8_4_ + (int)((unkuint10)Var36 >> 0x10) + iVar64;
                                iVar65 = auVar175._12_4_ + iVar182 + iVar65;
                                iVar182 = CONCAT22(auVar126._8_2_,
                                                   sVar179 * (short)((unkuint10)auVar146._0_10_ >>
                                                                    0x40));
                                auVar183._0_8_ =
                                     CONCAT26(auVar126._10_2_,
                                              CONCAT24(sVar180 * auVar146._10_2_,iVar182));
                                auVar183._8_2_ = sVar181 * auVar147._12_2_;
                                auVar183._10_2_ = auVar126._12_2_;
                                auVar184._12_2_ = auVar171._14_2_ * auVar148._14_2_;
                                auVar184._0_12_ = auVar183;
                                auVar184._14_2_ = auVar126._14_2_;
                                auVar132._0_4_ =
                                     iVar182 + CONCAT22(auVar126._0_2_,auVar165._0_2_ * sVar142) +
                                               auVar132._0_4_;
                                auVar132._4_4_ =
                                     (int)((ulong)auVar183._0_8_ >> 0x20) + auVar44._0_4_ + iVar133;
                                auVar132._8_4_ =
                                     auVar183._8_4_ + (int)((unkuint10)Var39 >> 0x10) + iVar134;
                                auVar132._12_4_ = auVar184._12_4_ + iVar56 + iVar135;
                                iVar182 = CONCAT22(auVar155._8_2_,sVar179 * auVar150._8_2_);
                                auVar186._0_8_ =
                                     CONCAT26(auVar155._10_2_,
                                              CONCAT24(sVar180 * auVar151._10_2_,iVar182));
                                auVar186._8_2_ = sVar181 * auVar152._12_2_;
                                auVar186._10_2_ = auVar155._12_2_;
                                auVar187._12_2_ = auVar171._14_2_ * auVar153._14_2_;
                                auVar187._0_12_ = auVar186;
                                auVar187._14_2_ = auVar155._14_2_;
                                iVar102 = iVar182 + CONCAT22(auVar155._0_2_,
                                                             auVar165._0_2_ * auVar149._0_2_) +
                                                    iVar102;
                                iVar113 = (int)((ulong)auVar186._0_8_ >> 0x20) +
                                          auVar45._0_4_ + iVar113;
                                iVar114 = auVar186._8_4_ + (int)((unkuint10)Var42 >> 0x10) + iVar114
                                ;
                                iVar115 = auVar187._12_4_ + iVar57 + iVar115;
                                iVar182 = CONCAT22(auVar112._8_2_,
                                                   sVar179 * (short)((unkuint10)auVar139._0_10_ >>
                                                                    0x40));
                                auVar189._0_8_ =
                                     CONCAT26(auVar112._10_2_,
                                              CONCAT24(sVar180 * auVar139._10_2_,iVar182));
                                auVar189._8_2_ = sVar181 * auVar140._12_2_;
                                auVar189._10_2_ = auVar112._12_2_;
                                auVar190._12_2_ = auVar171._14_2_ * auVar141._14_2_;
                                auVar190._0_12_ = auVar189;
                                auVar190._14_2_ = auVar112._14_2_;
                                iVar116 = iVar182 + CONCAT22(auVar112._0_2_,auVar165._0_2_ * sVar129
                                                            ) + iVar116;
                                iVar128 = (int)((ulong)auVar189._0_8_ >> 0x20) +
                                          auVar46._0_4_ + iVar128;
                                iVar130 = auVar189._8_4_ + (int)((unkuint10)Var55 >> 0x10) + iVar130
                                ;
                                iVar131 = auVar190._12_4_ + iVar58 + iVar131;
                                lVar70 = lVar70 + 4;
                              } while ((ulong)uVar59 << 2 != lVar70);
                              pvVar74 = (void *)((long)pvVar74 + (ulong)uVar59 * 0x20);
                            }
                            uVar66 = uVar66 + 1;
                          } while (uVar66 != uVar62);
                        }
                        piVar33 = local_1d0 + (long)local_198 * 4;
                        *piVar33 = iVar65 + iVar64 + iVar61 + iVar86;
                        piVar33[1] = auVar132._12_4_ + auVar132._8_4_ +
                                     auVar132._4_4_ + auVar132._0_4_;
                        piVar33[2] = iVar115 + iVar114 + iVar113 + iVar102;
                        piVar33[3] = iVar131 + iVar130 + iVar128 + iVar116;
                        puVar79 = local_198 + 1;
                      } while (local_198 + 1 != puVar73);
                    }
                    local_1d0 = local_1d0 + (long)iVar80 * 4;
                    local_1d8 = (void *)((long)local_1d8 + 1);
                  } while (local_1d8 != (void *)uVar83);
                }
                local_1e8 = (void *)((long)local_1e8 + 1);
              } while ((Mat *)local_1e8 != local_1c0);
            }
            iVar86 = (int)local_1a0;
            iVar60 = (int)local_190;
            if ((pointer)local_128._0_8_ != (pointer)0x0) {
              operator_delete((void *)local_128._0_8_,local_128._16_8_ - local_128._0_8_);
            }
          }
          goto LAB_001b2c78;
        }
        conv3x3s1_winograd43_pack8to4_int8_sse
                  (&local_178,&local_d8,&local_1a8->weight_winograd43_data,local_180);
      }
    }
    else {
LAB_001b2c78:
      iVar82 = local_d8.w;
      iVar80 = local_178.c;
      iVar63 = local_178.w;
      if ((iVar86 == 1) && (iVar60 == 4)) {
        p_Var31 = pCVar84->_vptr_Convolution_x86[-3];
        uVar71 = *(uint *)(p_Var31 + 0x2c + (long)&(pCVar84->weight_winograd23_data).data);
        piVar67 = (pointer)(ulong)uVar71;
        if (piVar67 == (pointer)0x7) {
          if ((((*(int *)(p_Var31 + 0x30 + (long)&(pCVar84->weight_winograd23_data).data) != 7) ||
               (*(int *)(p_Var31 + 0x34 + (long)&(pCVar84->weight_winograd23_data).data) != 1)) ||
              (*(int *)(p_Var31 + 0x38 + (long)&(pCVar84->weight_winograd23_data).data) != 1)) ||
             ((*(int *)(p_Var31 + 0x3c + (long)&(pCVar84->weight_winograd23_data).data) != 2 ||
              (*(int *)(p_Var31 + 0x40 + (long)&(pCVar84->weight_winograd23_data).data) != 2))))
          goto LAB_001b2e8a;
          conv7x7s2_pack1to4_int8_sse(&local_178,&local_d8,&pCVar84->weight_sgemm_data,local_180);
        }
        else if (uVar71 == 3) {
          if (*(int *)(p_Var31 + 0x30 + (long)&(pCVar84->weight_winograd23_data).data) != 3)
          goto LAB_001b2e8a;
          if (((*(int *)(p_Var31 + 0x34 + (long)&(pCVar84->weight_winograd23_data).data) == 1) &&
              (*(int *)(p_Var31 + 0x38 + (long)&(pCVar84->weight_winograd23_data).data) == 1)) &&
             ((*(int *)(p_Var31 + 0x3c + (long)&(pCVar84->weight_winograd23_data).data) == 1 &&
              (*(int *)(p_Var31 + 0x40 + (long)&(pCVar84->weight_winograd23_data).data) == 1)))) {
            conv3x3s1_pack1to4_int8_sse(&local_178,&local_d8,&pCVar84->weight_sgemm_data,local_180);
          }
          else {
            if ((((*(int *)(p_Var31 + 0x34 + (long)&(pCVar84->weight_winograd23_data).data) != 1) ||
                 (*(int *)(p_Var31 + 0x38 + (long)&(pCVar84->weight_winograd23_data).data) != 1)) ||
                (*(int *)(p_Var31 + 0x3c + (long)&(pCVar84->weight_winograd23_data).data) != 2)) ||
               (*(int *)(p_Var31 + 0x40 + (long)&(pCVar84->weight_winograd23_data).data) != 2))
            goto LAB_001b2e8a;
            conv3x3s2_pack1to4_int8_sse(&local_178,&local_d8,&pCVar84->weight_sgemm_data,local_180);
          }
        }
        else {
          if ((uVar71 != 1) ||
             (*(int *)(p_Var31 + 0x30 + (long)&(pCVar84->weight_winograd23_data).data) != 1)) {
LAB_001b2e8a:
            local_1d8 = (void *)(ulong)*(uint *)(p_Var31 + 0x30 +
                                                (long)&(pCVar84->weight_winograd23_data).data);
            local_1c8 = (void *)(long)*(int *)(p_Var31 + 0x34 +
                                              (long)&(pCVar84->weight_winograd23_data).data);
            local_130 = (void *)(long)*(int *)(p_Var31 + 0x38 +
                                              (long)&(pCVar84->weight_winograd23_data).data);
            iVar60 = *(int *)(p_Var31 + 0x3c + (long)&(pCVar84->weight_winograd23_data).data);
            lVar70 = (long)iVar60;
            local_1b8 = (pointer)(long)*(int *)(p_Var31 + 0x40 +
                                               (long)&(pCVar84->weight_winograd23_data).data);
            puVar79 = (undefined1 *)(ulong)(uint)local_178.c;
            lVar81 = (long)local_d8.w;
            puVar73 = (undefined1 *)(ulong)(uint)local_d8.h;
            uVar71 = *(uint *)(p_Var31 + 0x30 + (long)&(pCVar84->weight_winograd23_data).data) *
                     uVar71;
            local_1d0 = piVar67;
            local_198 = puVar73;
            if (local_180->use_sgemm_convolution == true) {
              local_e8 = 0;
              local_128._0_8_ = (pointer)0x0;
              local_128._8_4_ = 0;
              local_128._12_4_ = 0;
              local_128._16_8_ = (Allocator *)0x0;
              local_128._24_4_ = 0;
              local_128._32_8_ = (Allocator *)0x0;
              local_128._40_4_ = 0;
              local_128._44_4_ = 0;
              local_128._48_12_ = SUB1612((undefined1  [16])0x0,4);
              Mat::create((Mat *)local_128,local_d8.h * local_d8.w,uVar71,local_178.c,1,1,
                          local_180->workspace_allocator);
              local_e0 = &local_1a8->weight_sgemm_data;
              if (0 < iVar80) {
                iVar63 = iVar63 * (int)local_1b8;
                local_1c0 = (Mat *)0x0;
                do {
                  if (0 < (int)local_1d8) {
                    local_1b0 = (void *)((long)local_178.data +
                                        local_178.cstep * (long)local_1c0 * local_178.elemsize);
                    piVar67 = (pointer)(local_128._0_8_ +
                                       local_e8 * (long)local_1c0 * local_128._16_8_);
                    local_1b8 = (pointer)((long)local_178.w * local_178.elemsize * (long)local_130);
                    lVar81 = 0;
                    do {
                      if (0 < (int)local_1d0) {
                        lVar75 = 0;
                        do {
                          if (0 < (int)puVar73) {
                            puVar68 = (undefined1 *)
                                      ((long)local_1b0 +
                                      lVar75 * (long)local_1c8 + (long)local_1b8 * lVar81);
                            iVar80 = 0;
                            do {
                              if (iVar82 < 4) {
                                uVar71 = 0;
                              }
                              else {
                                iVar86 = 3;
                                do {
                                  *(undefined1 *)piVar67 = *puVar68;
                                  *(undefined1 *)((long)piVar67 + 1) = puVar68[lVar70];
                                  *(undefined1 *)((long)piVar67 + 2) = puVar68[iVar60 * 2];
                                  *(undefined1 *)((long)piVar67 + 3) = puVar68[iVar60 * 3];
                                  puVar68 = puVar68 + lVar70 * 4;
                                  piVar67 = piVar67 + 1;
                                  iVar86 = iVar86 + 4;
                                  uVar71 = iVar82 & 0xfffffffc;
                                } while (iVar86 < iVar82);
                              }
                              uVar72 = uVar71 | 1;
                              while ((int)uVar72 < iVar82) {
                                *(undefined1 *)piVar67 = *puVar68;
                                *(undefined1 *)((long)piVar67 + 1) = puVar68[lVar70];
                                puVar68 = puVar68 + iVar60 * 2;
                                piVar67 = (pointer)((long)piVar67 + 2);
                                uVar72 = uVar71 + 3;
                                uVar71 = uVar71 + 2;
                              }
                              if ((int)uVar71 < iVar82) {
                                iVar86 = iVar82 - uVar71;
                                do {
                                  *(undefined1 *)piVar67 = *puVar68;
                                  puVar68 = puVar68 + lVar70;
                                  piVar67 = (pointer)((long)piVar67 + 1);
                                  iVar86 = iVar86 + -1;
                                } while (iVar86 != 0);
                              }
                              puVar68 = puVar68 + (iVar63 - iVar82 * iVar60);
                              iVar80 = iVar80 + 1;
                              puVar73 = local_198;
                            } while (iVar80 != (int)local_198);
                          }
                          lVar75 = lVar75 + 1;
                        } while ((pointer)lVar75 != local_1d0);
                      }
                      lVar81 = lVar81 + 1;
                    } while ((void *)lVar81 != local_1d8);
                  }
                  local_1c0 = (Mat *)((long)&local_1c0->data + 1);
                } while (local_1c0 != (Mat *)puVar79);
              }
              im2col_sgemm_pack1to4_int8_sse((Mat *)local_128,&local_d8,local_e0,local_180);
              pCVar84 = local_1a8;
              piVar33 = (int *)CONCAT44(local_128._12_4_,local_128._8_4_);
              iVar86 = (int)local_1a0;
              iVar60 = (int)local_190;
              if (piVar33 != (int *)0x0) {
                LOCK();
                *piVar33 = *piVar33 + -1;
                UNLOCK();
                if (*piVar33 == 0) {
                  if ((Allocator *)local_128._32_8_ == (Allocator *)0x0) {
                    if ((pointer)local_128._0_8_ != (pointer)0x0) {
                      free((void *)local_128._0_8_);
                    }
                  }
                  else {
                    (*(*(_func_int ***)local_128._32_8_)[3])();
                  }
                }
              }
            }
            else {
              local_1c0 = (Mat *)(ulong)(uint)local_d8.c;
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)local_128,(long)(int)uVar71,&local_1d9
                        );
              pCVar84 = local_1a8;
              if (0 < (int)local_1d8) {
                iVar64 = (int)local_1d0;
                iVar60 = 0;
                iVar86 = 0;
                iVar61 = 0;
                do {
                  if (0 < iVar64) {
                    lVar75 = 0;
                    do {
                      *(int *)(local_128._0_8_ + (iVar60 + lVar75) * 4) = iVar86;
                      iVar86 = iVar86 + (int)local_1c8;
                      lVar75 = lVar75 + 1;
                    } while (iVar64 != (int)lVar75);
                    iVar60 = iVar60 + (int)lVar75;
                  }
                  iVar86 = iVar86 + (iVar63 * (int)local_130 - (int)local_1c8 * iVar64);
                  iVar61 = iVar61 + 1;
                } while (iVar61 != (int)local_1d8);
              }
              if (0 < (int)local_1c0) {
                local_1b0 = (void *)(lVar81 * 4);
                local_1e8 = (void *)0x0;
                do {
                  if (0 < (int)puVar73) {
                    local_1d0 = (pointer)(local_d8.cstep * (long)local_1e8 * local_d8.elemsize +
                                         (long)local_d8.data);
                    local_1d8 = (void *)0x0;
                    do {
                      if (0 < iVar82) {
                        local_1c8 = (void *)((long)local_1d8 * (long)local_1b8);
                        lVar75 = 0;
                        do {
                          if (iVar80 < 1) {
                            iVar60 = 0;
                            iVar63 = 0;
                            iVar86 = 0;
                            iVar61 = 0;
                          }
                          else {
                            pvVar74 = (void *)((local_1a8->weight_data_tm).cstep * (long)local_1e8 *
                                               (local_1a8->weight_data_tm).elemsize +
                                              (long)(local_1a8->weight_data_tm).data);
                            iVar60 = 0;
                            iVar63 = 0;
                            iVar86 = 0;
                            iVar61 = 0;
                            lVar76 = 0;
                            do {
                              if (0 < (int)uVar71) {
                                uVar83 = 0;
                                do {
                                  auVar112 = ZEXT416((uint)(int)*(char *)((long)local_178.data +
                                                                         (long)*(int *)(local_128.
                                                                                        _0_8_ + 
                                                  uVar83 * 4) +
                                                  local_178.cstep * local_178.elemsize * lVar76 +
                                                  lVar75 * lVar70 +
                                                  (long)local_178.w * (long)local_1c8 *
                                                  local_178.elemsize));
                                  auVar112 = pshuflw(auVar112,auVar112,0);
                                  auVar103._0_4_ = auVar112._0_4_;
                                  auVar103._4_4_ = auVar103._0_4_;
                                  auVar103._8_4_ = auVar103._0_4_;
                                  auVar103._12_4_ = auVar103._0_4_;
                                  uVar62 = *(ulong *)((long)pvVar74 + uVar83 * 4);
                                  cVar96 = (char)(uVar62 >> 8);
                                  cVar97 = (char)(uVar62 >> 0x10);
                                  cVar98 = (char)(uVar62 >> 0x18);
                                  cVar99 = (char)(uVar62 >> 0x20);
                                  cVar100 = (char)(uVar62 >> 0x28);
                                  cVar101 = (char)(uVar62 >> 0x30);
                                  auVar125._8_6_ = 0;
                                  auVar125._0_8_ = uVar62;
                                  auVar125[0xe] = (char)(uVar62 >> 0x38);
                                  auVar125[0xf] = -((long)uVar62 < 0);
                                  auVar124._14_2_ = auVar125._14_2_;
                                  auVar124._8_5_ = 0;
                                  auVar124._0_8_ = uVar62;
                                  auVar124[0xd] = -(cVar101 < '\0');
                                  auVar123._13_3_ = auVar124._13_3_;
                                  auVar123._8_4_ = 0;
                                  auVar123._0_8_ = uVar62;
                                  auVar123[0xc] = cVar101;
                                  auVar122._12_4_ = auVar123._12_4_;
                                  auVar122._8_3_ = 0;
                                  auVar122._0_8_ = uVar62;
                                  auVar122[0xb] = -(cVar100 < '\0');
                                  auVar121._11_5_ = auVar122._11_5_;
                                  auVar121._8_2_ = 0;
                                  auVar121._0_8_ = uVar62;
                                  auVar121[10] = cVar100;
                                  auVar120._10_6_ = auVar121._10_6_;
                                  auVar120[8] = 0;
                                  auVar120._0_8_ = uVar62;
                                  auVar120[9] = -(cVar99 < '\0');
                                  auVar119._9_7_ = auVar120._9_7_;
                                  auVar119[8] = cVar99;
                                  auVar119._0_8_ = uVar62;
                                  Var36 = CONCAT91(CONCAT81(auVar119._8_8_,-(cVar98 < '\0')),cVar98)
                                  ;
                                  auVar48._2_10_ = Var36;
                                  auVar48[1] = -(cVar97 < '\0');
                                  auVar48[0] = cVar97;
                                  auVar47._2_12_ = auVar48;
                                  auVar47[1] = -(cVar96 < '\0');
                                  auVar47[0] = cVar96;
                                  auVar118._0_2_ = CONCAT11(-((char)uVar62 < '\0'),(char)uVar62);
                                  auVar118._2_14_ = auVar47;
                                  sVar129 = auVar112._2_2_ * (short)Var36;
                                  auVar126 = pmulhw(auVar118,auVar103);
                                  iVar64 = CONCAT22(auVar126._6_2_,sVar129);
                                  Var36 = CONCAT64(CONCAT42(iVar64,auVar126._4_2_),
                                                   CONCAT22(auVar112._0_2_ * auVar48._0_2_,sVar129))
                                  ;
                                  auVar49._4_8_ = (long)((unkuint10)Var36 >> 0x10);
                                  auVar49._2_2_ = auVar126._2_2_;
                                  auVar49._0_2_ = auVar112._2_2_ * auVar47._0_2_;
                                  iVar60 = iVar60 + CONCAT22(auVar126._0_2_,
                                                             auVar112._0_2_ * auVar118._0_2_);
                                  iVar63 = iVar63 + auVar49._0_4_;
                                  iVar86 = iVar86 + (int)((unkuint10)Var36 >> 0x10);
                                  iVar61 = iVar61 + iVar64;
                                  uVar83 = uVar83 + 1;
                                } while (uVar71 != uVar83);
                                pvVar74 = (void *)((long)pvVar74 + (ulong)uVar71 * 4);
                              }
                              lVar76 = lVar76 + 1;
                            } while ((undefined1 *)lVar76 != puVar79);
                          }
                          piVar33 = local_1d0 + lVar75 * 4;
                          *piVar33 = iVar60;
                          piVar33[1] = iVar63;
                          piVar33[2] = iVar86;
                          piVar33[3] = iVar61;
                          lVar75 = lVar75 + 1;
                        } while (lVar75 != lVar81);
                      }
                      local_1d0 = local_1d0 + lVar81 * 4;
                      local_1d8 = (void *)((long)local_1d8 + 1);
                      puVar73 = local_198;
                    } while ((undefined1 *)local_1d8 != local_198);
                  }
                  local_1e8 = (void *)((long)local_1e8 + 1);
                } while ((Mat *)local_1e8 != local_1c0);
              }
              iVar86 = (int)local_1a0;
              iVar60 = (int)local_190;
              if ((pointer)local_128._0_8_ != (pointer)0x0) {
                operator_delete((void *)local_128._0_8_,local_128._16_8_ - local_128._0_8_);
              }
            }
            goto LAB_001b33e2;
          }
          if (((*(int *)(p_Var31 + 0x34 + (long)&(pCVar84->weight_winograd23_data).data) == 1) &&
              ((*(int *)(p_Var31 + 0x38 + (long)&(pCVar84->weight_winograd23_data).data) == 1 &&
               (*(int *)(p_Var31 + 0x3c + (long)&(pCVar84->weight_winograd23_data).data) == 1)))) &&
             (*(int *)(p_Var31 + 0x40 + (long)&(pCVar84->weight_winograd23_data).data) == 1)) {
            conv1x1s1_sgemm_pack1to4_int8_sse
                      (&local_178,&local_d8,&pCVar84->weight_sgemm_data,local_180);
          }
          else {
            if ((((*(int *)(p_Var31 + 0x34 + (long)&(pCVar84->weight_winograd23_data).data) != 1) ||
                 (*(int *)(p_Var31 + 0x38 + (long)&(pCVar84->weight_winograd23_data).data) != 1)) ||
                (*(int *)(p_Var31 + 0x3c + (long)&(pCVar84->weight_winograd23_data).data) != 2)) ||
               (*(int *)(p_Var31 + 0x40 + (long)&(pCVar84->weight_winograd23_data).data) != 2))
            goto LAB_001b2e8a;
            conv1x1s2_sgemm_pack1to4_int8_sse
                      (&local_178,&local_d8,&pCVar84->weight_sgemm_data,local_180);
          }
        }
      }
      else {
LAB_001b33e2:
        iVar82 = local_d8.w;
        iVar80 = local_178.c;
        iVar63 = local_178.w;
        if ((iVar86 == 8) && (iVar60 == 1)) {
          p_Var31 = pCVar84->_vptr_Convolution_x86[-3];
          uVar71 = *(uint *)(p_Var31 + 0x2c + (long)&(pCVar84->weight_winograd23_data).data);
          if (((ulong)uVar71 == 1) &&
             (*(int *)(p_Var31 + 0x30 + (long)&(pCVar84->weight_winograd23_data).data) == 1)) {
            if ((*(int *)(p_Var31 + 0x34 + (long)&(pCVar84->weight_winograd23_data).data) == 1) &&
               (((*(int *)(p_Var31 + 0x38 + (long)&(pCVar84->weight_winograd23_data).data) == 1 &&
                 (*(int *)(p_Var31 + 0x3c + (long)&(pCVar84->weight_winograd23_data).data) == 1)) &&
                (*(int *)(p_Var31 + 0x40 + (long)&(pCVar84->weight_winograd23_data).data) == 1)))) {
              conv1x1s1_sgemm_pack8to1_int8_sse
                        (&local_178,&local_d8,&pCVar84->weight_sgemm_data,local_180);
            }
            else {
              if ((((*(int *)(p_Var31 + 0x34 + (long)&(pCVar84->weight_winograd23_data).data) != 1)
                   || (*(int *)(p_Var31 + 0x38 + (long)&(pCVar84->weight_winograd23_data).data) != 1
                      )) || (*(int *)(p_Var31 + 0x3c + (long)&(pCVar84->weight_winograd23_data).data
                                     ) != 2)) ||
                 (*(int *)(p_Var31 + 0x40 + (long)&(pCVar84->weight_winograd23_data).data) != 2))
              goto LAB_001b355f;
              conv1x1s2_sgemm_pack8to1_int8_sse
                        (&local_178,&local_d8,&pCVar84->weight_sgemm_data,local_180);
            }
          }
          else {
LAB_001b355f:
            if (((local_180->use_winograd_convolution == true) && (uVar71 == 3)) &&
               ((local_180->use_winograd43_convolution != false &&
                ((((*(int *)(p_Var31 + 0x30 + (long)&(pCVar84->weight_winograd23_data).data) == 3 &&
                   (*(int *)(p_Var31 + 0x34 + (long)&(pCVar84->weight_winograd23_data).data) == 1))
                  && (*(int *)(p_Var31 + 0x38 + (long)&(pCVar84->weight_winograd23_data).data) == 1)
                  ) && ((*(int *)(p_Var31 + 0x3c + (long)&(pCVar84->weight_winograd23_data).data) ==
                         1 && (*(int *)(p_Var31 + 0x40 +
                                       (long)&(pCVar84->weight_winograd23_data).data) == 1)))))))) {
              conv3x3s1_winograd43_pack8to1_int8_sse
                        (&local_178,&local_d8,&pCVar84->weight_winograd43_data,local_180);
            }
            else {
              local_1c8 = (void *)(ulong)*(uint *)(p_Var31 + 0x30 +
                                                  (long)&(pCVar84->weight_winograd23_data).data);
              local_1d0 = (pointer)(long)*(int *)(p_Var31 + 0x34 +
                                                 (long)&(pCVar84->weight_winograd23_data).data);
              iVar60 = *(int *)(p_Var31 + 0x38 + (long)&(pCVar84->weight_winograd23_data).data);
              iVar86 = *(int *)(p_Var31 + 0x3c + (long)&(pCVar84->weight_winograd23_data).data);
              local_1a0 = (ulong)*(int *)(p_Var31 + 0x40 +
                                         (long)&(pCVar84->weight_winograd23_data).data);
              uVar83 = (ulong)(uint)local_178.c;
              uVar62 = (ulong)(uint)local_d8.w;
              local_198 = (undefined1 *)(ulong)(uint)local_d8.h;
              uVar72 = *(uint *)(p_Var31 + 0x30 + (long)&(pCVar84->weight_winograd23_data).data) *
                       uVar71;
              if (local_180->use_sgemm_convolution == true) {
                local_e8 = 0;
                local_128._0_8_ = (pointer)0x0;
                local_128._8_4_ = 0;
                local_128._12_4_ = 0;
                local_128._16_8_ = (Allocator *)0x0;
                local_128._24_4_ = 0;
                local_128._32_8_ = (Allocator *)0x0;
                local_128._40_4_ = 0;
                local_128._44_4_ = 0;
                local_128._48_12_ = SUB1612((undefined1  [16])0x0,4);
                Mat::create((Mat *)local_128,local_d8.h * local_d8.w,uVar72,local_178.c,8,8,
                            local_180->workspace_allocator);
                local_1c0 = &local_1a8->weight_sgemm_data;
                if (0 < iVar80) {
                  local_1b0 = local_178.data;
                  local_1b8 = (pointer)local_128._0_8_;
                  local_1d8 = (void *)((long)local_178.w * (long)iVar60);
                  local_1e8 = (void *)0x0;
                  do {
                    if (0 < (int)local_1c8) {
                      piVar67 = (pointer)(local_128._0_8_ +
                                         local_e8 * (long)local_1e8 * local_128._16_8_);
                      pvVar74 = (void *)0x0;
                      do {
                        if (0 < (int)uVar71) {
                          uVar66 = 0;
                          do {
                            if (0 < (int)local_198) {
                              puVar77 = (undefined8 *)
                                        ((long)local_178.data +
                                        uVar66 * (long)local_1d0 * 8 +
                                        local_178.elemsize * (long)local_1d8 * (long)pvVar74 +
                                        local_178.cstep * (long)local_1e8 * local_178.elemsize);
                              iVar60 = 0;
                              do {
                                uVar87 = uVar62;
                                if (0 < iVar82) {
                                  do {
                                    *(undefined8 *)piVar67 = *puVar77;
                                    piVar67 = piVar67 + 2;
                                    puVar77 = puVar77 + iVar86;
                                    uVar72 = (int)uVar87 - 1;
                                    uVar87 = (ulong)uVar72;
                                  } while (uVar72 != 0);
                                }
                                puVar77 = puVar77 + (iVar63 * (int)local_1a0 - iVar82 * iVar86);
                                iVar60 = iVar60 + 1;
                              } while (iVar60 != (int)local_198);
                            }
                            uVar66 = uVar66 + 1;
                          } while (uVar66 != uVar71);
                        }
                        pvVar74 = (void *)((long)pvVar74 + 1);
                      } while (pvVar74 != local_1c8);
                    }
                    local_1e8 = (void *)((long)local_1e8 + 1);
                  } while (local_1e8 != (void *)uVar83);
                }
                im2col_sgemm_pack8to1_int8_sse((Mat *)local_128,&local_d8,local_1c0,local_180);
                piVar33 = (int *)CONCAT44(local_128._12_4_,local_128._8_4_);
                if (piVar33 != (int *)0x0) {
                  LOCK();
                  *piVar33 = *piVar33 + -1;
                  UNLOCK();
                  if (*piVar33 == 0) {
                    if ((Allocator *)local_128._32_8_ == (Allocator *)0x0) {
LAB_001b4204:
                      if ((pointer)local_128._0_8_ != (pointer)0x0) {
                        free((void *)local_128._0_8_);
                      }
                    }
                    else {
                      (*(*(_func_int ***)local_128._32_8_)[3])();
                    }
                  }
                }
              }
              else {
                local_190 = (Mat *)(ulong)(uint)local_d8.c;
                std::vector<int,_std::allocator<int>_>::vector
                          ((vector<int,_std::allocator<int>_> *)local_128,(long)(int)uVar72,
                           &local_1d9);
                if (0 < (int)local_1c8) {
                  iVar61 = 0;
                  iVar64 = 0;
                  iVar65 = 0;
                  do {
                    if (0 < (int)uVar71) {
                      lVar70 = 0;
                      do {
                        *(int *)(local_128._0_8_ + (iVar61 + lVar70) * 4) = iVar64;
                        iVar64 = iVar64 + (int)local_1d0;
                        lVar70 = lVar70 + 1;
                      } while (uVar71 != (uint)lVar70);
                      iVar61 = iVar61 + (uint)lVar70;
                    }
                    iVar64 = iVar64 + (iVar63 * iVar60 - (int)local_1d0 * uVar71);
                    iVar65 = iVar65 + 1;
                  } while (iVar65 != (int)local_1c8);
                }
                if (0 < (int)local_190) {
                  local_1c0 = (Mat *)(long)iVar82;
                  local_130 = local_d8.data;
                  local_e0 = (Mat *)(local_d8.elemsize * local_d8.cstep);
                  local_188 = 0;
                  do {
                    if (0 < (int)local_198) {
                      local_1c8 = (void *)((long)local_e0 * local_188 + (long)local_d8.data);
                      local_1b0 = (void *)((local_1a8->weight_data_tm).cstep * local_188 *
                                           (local_1a8->weight_data_tm).elemsize +
                                          (long)(local_1a8->weight_data_tm).data);
                      local_1b8 = (pointer)0x0;
                      do {
                        if (0 < iVar82) {
                          local_1d8 = (void *)((long)local_1b8 * local_1a0 * local_178.elemsize);
                          piVar67 = (pointer)0x0;
                          do {
                            local_1d0 = piVar67;
                            if (iVar80 < 1) {
                              iVar60 = 0;
                            }
                            else {
                              uVar66 = 0;
                              iVar60 = 0;
                              pvVar74 = local_1b0;
                              do {
                                if (0 < (int)uVar72) {
                                  uVar87 = 0;
                                  do {
                                    uVar1 = *(ulong *)((long)local_178.data +
                                                      (long)*(int *)(local_128._0_8_ + uVar87 * 4) *
                                                      8 + local_178.cstep * local_178.elemsize *
                                                          uVar66 + (long)local_178.w *
                                                                   (long)local_1d8 +
                                                                   (long)(iVar86 * 8 *
                                                                         (int)local_1d0));
                                    cVar96 = (char)(uVar1 >> 8);
                                    cVar97 = (char)(uVar1 >> 0x10);
                                    cVar98 = (char)(uVar1 >> 0x18);
                                    cVar99 = (char)(uVar1 >> 0x20);
                                    cVar100 = (char)(uVar1 >> 0x28);
                                    cVar101 = (char)(uVar1 >> 0x30);
                                    auVar95._8_6_ = 0;
                                    auVar95._0_8_ = uVar1;
                                    auVar95[0xe] = (char)(uVar1 >> 0x38);
                                    auVar95[0xf] = -((long)uVar1 < 0);
                                    auVar94._14_2_ = auVar95._14_2_;
                                    auVar94._8_5_ = 0;
                                    auVar94._0_8_ = uVar1;
                                    auVar94[0xd] = -(cVar101 < '\0');
                                    auVar93._13_3_ = auVar94._13_3_;
                                    auVar93._8_4_ = 0;
                                    auVar93._0_8_ = uVar1;
                                    auVar93[0xc] = cVar101;
                                    auVar92._12_4_ = auVar93._12_4_;
                                    auVar92._8_3_ = 0;
                                    auVar92._0_8_ = uVar1;
                                    auVar92[0xb] = -(cVar100 < '\0');
                                    auVar91._11_5_ = auVar92._11_5_;
                                    auVar91._8_2_ = 0;
                                    auVar91._0_8_ = uVar1;
                                    auVar91[10] = cVar100;
                                    auVar90._10_6_ = auVar91._10_6_;
                                    auVar90[8] = 0;
                                    auVar90._0_8_ = uVar1;
                                    auVar90[9] = -(cVar99 < '\0');
                                    auVar89._9_7_ = auVar90._9_7_;
                                    auVar89[8] = cVar99;
                                    auVar89._0_8_ = uVar1;
                                    Var36 = CONCAT91(CONCAT81(auVar89._8_8_,-(cVar98 < '\0')),cVar98
                                                    );
                                    auVar51._2_10_ = Var36;
                                    auVar51[1] = -(cVar97 < '\0');
                                    auVar51[0] = cVar97;
                                    auVar50._2_12_ = auVar51;
                                    auVar50[1] = -(cVar96 < '\0');
                                    auVar50[0] = cVar96;
                                    auVar88._0_2_ = CONCAT11(-((char)uVar1 < '\0'),(char)uVar1);
                                    auVar88._2_14_ = auVar50;
                                    uVar1 = *(ulong *)((long)pvVar74 + uVar87 * 8);
                                    cVar96 = (char)(uVar1 >> 8);
                                    cVar97 = (char)(uVar1 >> 0x10);
                                    cVar98 = (char)(uVar1 >> 0x18);
                                    cVar99 = (char)(uVar1 >> 0x20);
                                    cVar100 = (char)(uVar1 >> 0x28);
                                    cVar101 = (char)(uVar1 >> 0x30);
                                    auVar111._8_6_ = 0;
                                    auVar111._0_8_ = uVar1;
                                    auVar111[0xe] = (char)(uVar1 >> 0x38);
                                    auVar111[0xf] = -((long)uVar1 < 0);
                                    auVar110._14_2_ = auVar111._14_2_;
                                    auVar110._8_5_ = 0;
                                    auVar110._0_8_ = uVar1;
                                    auVar110[0xd] = -(cVar101 < '\0');
                                    auVar109._13_3_ = auVar110._13_3_;
                                    auVar109._8_4_ = 0;
                                    auVar109._0_8_ = uVar1;
                                    auVar109[0xc] = cVar101;
                                    auVar108._12_4_ = auVar109._12_4_;
                                    auVar108._8_3_ = 0;
                                    auVar108._0_8_ = uVar1;
                                    auVar108[0xb] = -(cVar100 < '\0');
                                    auVar107._11_5_ = auVar108._11_5_;
                                    auVar107._8_2_ = 0;
                                    auVar107._0_8_ = uVar1;
                                    auVar107[10] = cVar100;
                                    auVar106._10_6_ = auVar107._10_6_;
                                    auVar106[8] = 0;
                                    auVar106._0_8_ = uVar1;
                                    auVar106[9] = -(cVar99 < '\0');
                                    auVar105._9_7_ = auVar106._9_7_;
                                    auVar105[8] = cVar99;
                                    auVar105._0_8_ = uVar1;
                                    Var39 = CONCAT91(CONCAT81(auVar105._8_8_,-(cVar98 < '\0')),
                                                     cVar98);
                                    auVar53._2_10_ = Var39;
                                    auVar53[1] = -(cVar97 < '\0');
                                    auVar53[0] = cVar97;
                                    auVar52._2_12_ = auVar53;
                                    auVar52[1] = -(cVar96 < '\0');
                                    auVar52[0] = cVar96;
                                    auVar104._0_2_ = CONCAT11(-((char)uVar1 < '\0'),(char)uVar1);
                                    auVar104._2_14_ = auVar52;
                                    sVar129 = (short)Var39 * (short)Var36;
                                    auVar112 = pmulhw(auVar104,auVar88);
                                    iVar63 = CONCAT22(auVar112._6_2_,sVar129);
                                    Var36 = CONCAT64(CONCAT42(iVar63,auVar112._4_2_),
                                                     CONCAT22(auVar53._0_2_ * auVar51._0_2_,sVar129)
                                                    );
                                    auVar54._4_8_ = (long)((unkuint10)Var36 >> 0x10);
                                    auVar54._2_2_ = auVar112._2_2_;
                                    auVar54._0_2_ = auVar52._0_2_ * auVar50._0_2_;
                                    iVar61 = CONCAT22(auVar112._8_2_,auVar105._8_2_ * auVar89._8_2_)
                                    ;
                                    auVar117._0_8_ =
                                         CONCAT26(auVar112._10_2_,
                                                  CONCAT24(auVar107._10_2_ * auVar91._10_2_,iVar61))
                                    ;
                                    auVar117._8_2_ = auVar109._12_2_ * auVar93._12_2_;
                                    auVar117._10_2_ = auVar112._12_2_;
                                    auVar127._12_2_ = auVar110._14_2_ * auVar94._14_2_;
                                    auVar127._0_12_ = auVar117;
                                    auVar127._14_2_ = auVar112._14_2_;
                                    iVar60 = iVar60 + auVar127._12_4_ + iVar63 +
                                                      (int)((ulong)auVar117._0_8_ >> 0x20) +
                                                      auVar54._0_4_ +
                                                      auVar117._8_4_ +
                                                      (int)((unkuint10)Var36 >> 0x10) +
                                                      iVar61 + CONCAT22(auVar112._0_2_,
                                                                        auVar104._0_2_ *
                                                                        auVar88._0_2_);
                                    uVar87 = uVar87 + 1;
                                  } while (uVar72 != uVar87);
                                  pvVar74 = (void *)((long)pvVar74 + (ulong)uVar72 * 8);
                                }
                                uVar66 = uVar66 + 1;
                              } while (uVar66 != uVar83);
                            }
                            *(int *)((long)local_1c8 + (long)local_1d0 * 4) = iVar60;
                            piVar67 = (pointer)((long)local_1d0 + 1U);
                          } while ((long)local_1d0 + 1U != uVar62);
                        }
                        local_1c8 = (void *)((long)local_1c8 + (long)local_1c0 * 4);
                        local_1b8 = (pointer)((long)local_1b8 + 1);
                      } while (local_1b8 != (pointer)local_198);
                    }
                    local_188 = local_188 + 1;
                  } while ((Mat *)local_188 != local_190);
                }
LAB_001b407d:
                if ((pointer)local_128._0_8_ != (pointer)0x0) {
                  operator_delete((void *)local_128._0_8_,local_128._16_8_ - local_128._0_8_);
                }
              }
            }
          }
        }
        else if (iVar86 == 1 && iVar60 == 1) {
          p_Var31 = local_1a8->_vptr_Convolution_x86[-3];
          uVar71 = *(uint *)(p_Var31 + 0x2c + (long)&(local_1a8->weight_winograd23_data).data);
          pvVar74 = (void *)(ulong)uVar71;
          if ((pvVar74 == (void *)0x1) &&
             (*(int *)(p_Var31 + 0x30 + (long)&(local_1a8->weight_winograd23_data).data) == 1)) {
            if ((*(int *)(p_Var31 + 0x34 + (long)&(local_1a8->weight_winograd23_data).data) == 1) &&
               (((*(int *)(p_Var31 + 0x38 + (long)&(local_1a8->weight_winograd23_data).data) == 1 &&
                 (*(int *)(p_Var31 + 0x3c + (long)&(local_1a8->weight_winograd23_data).data) == 1))
                && (*(int *)(p_Var31 + 0x40 + (long)&(local_1a8->weight_winograd23_data).data) == 1)
                ))) {
              conv1x1s1_sgemm_int8_sse(&local_178,&local_d8,&local_1a8->weight_sgemm_data,local_180)
              ;
            }
            else {
              if ((((*(int *)(p_Var31 + 0x34 + (long)&(local_1a8->weight_winograd23_data).data) != 1
                    ) || (*(int *)(p_Var31 + 0x38 + (long)&(local_1a8->weight_winograd23_data).data)
                          != 1)) ||
                  (*(int *)(p_Var31 + 0x3c + (long)&(local_1a8->weight_winograd23_data).data) != 2))
                 || (*(int *)(p_Var31 + 0x40 + (long)&(local_1a8->weight_winograd23_data).data) != 2
                    )) goto LAB_001b3ade;
              conv1x1s2_sgemm_int8_sse(&local_178,&local_d8,&local_1a8->weight_sgemm_data,local_180)
              ;
            }
          }
          else {
LAB_001b3ade:
            if ((((local_180->use_winograd_convolution == true) && (uVar71 == 3)) &&
                ((local_180->use_winograd23_convolution != false &&
                 (((*(int *)(p_Var31 + 0x30 + (long)&(local_1a8->weight_winograd23_data).data) == 3
                   && (*(int *)(p_Var31 + 0x34 + (long)&(local_1a8->weight_winograd23_data).data) ==
                       1)) &&
                  (*(int *)(p_Var31 + 0x38 + (long)&(local_1a8->weight_winograd23_data).data) == 1))
                 )))) && ((*(int *)(p_Var31 + 0x3c + (long)&(local_1a8->weight_winograd23_data).data
                                   ) == 1 &&
                          (*(int *)(p_Var31 + 0x40 + (long)&(local_1a8->weight_winograd23_data).data
                                   ) == 1)))) {
              if ((0xf < (int)local_1a0 * (int)local_188) &&
                 (0xf < *(int *)(p_Var31 + 0x28 + (long)&(local_1a8->weight_winograd23_data).data)))
              {
                conv3x3s1_winograd23_int8_sse
                          (&local_178,&local_d8,&local_1a8->weight_winograd23_data,local_180);
                goto LAB_001b4092;
              }
            }
            local_1b0 = (void *)(ulong)*(uint *)(p_Var31 + 0x30 +
                                                (long)&(local_1a8->weight_winograd23_data).data);
            iVar60 = *(int *)(p_Var31 + 0x34 + (long)&(local_1a8->weight_winograd23_data).data);
            local_188 = (long)*(int *)(p_Var31 + 0x38 +
                                      (long)&(local_1a8->weight_winograd23_data).data);
            iVar63 = *(int *)(p_Var31 + 0x3c + (long)&(local_1a8->weight_winograd23_data).data);
            lVar70 = (long)iVar63;
            local_1a0 = (ulong)*(int *)(p_Var31 + 0x40 +
                                       (long)&(local_1a8->weight_winograd23_data).data);
            local_1d8 = (void *)CONCAT44(local_1d8._4_4_,local_178.w);
            uVar83 = (ulong)(uint)local_178.c;
            pvVar85 = (void *)(long)local_d8.w;
            puVar73 = (undefined1 *)(ulong)(uint)local_d8.h;
            uVar72 = *(uint *)(p_Var31 + 0x30 + (long)&(local_1a8->weight_winograd23_data).data) *
                     uVar71;
            local_198 = puVar73;
            if (local_180->use_sgemm_convolution != true) {
              local_190 = (Mat *)(ulong)(uint)local_d8.c;
              local_1d0 = (pointer)(long)(int)uVar72;
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)local_128,(size_type)local_1d0,
                         &local_1d9);
              if (0 < (int)local_1b0) {
                iVar63 = 0;
                iVar86 = 0;
                iVar61 = 0;
                do {
                  if (0 < (int)uVar71) {
                    lVar81 = 0;
                    do {
                      *(int *)(local_128._0_8_ + (iVar63 + lVar81) * 4) = iVar61;
                      iVar61 = iVar61 + iVar60;
                      lVar81 = lVar81 + 1;
                    } while (uVar71 != (uint)lVar81);
                    iVar63 = iVar63 + (uint)lVar81;
                  }
                  iVar61 = iVar61 + ((int)local_1d8 * (int)local_188 - iVar60 * uVar71);
                  iVar86 = iVar86 + 1;
                } while (iVar86 != (int)local_1b0);
              }
              if (0 < (int)local_190) {
                local_130 = local_d8.data;
                local_e0 = (Mat *)(local_d8.elemsize * local_d8.cstep);
                local_80 = iVar80 * uVar72;
                local_188 = 0;
                do {
                  if (0 < (int)puVar73) {
                    local_1e8 = (void *)((long)local_e0 * local_188 + (long)local_d8.data);
                    local_1b8 = (pointer)((long)(local_80 * (int)local_188) +
                                         (long)(local_1a8->weight_data_tm).data);
                    local_1c0 = (Mat *)0x0;
                    do {
                      if (0 < iVar82) {
                        local_1d8 = local_178.data;
                        local_1b0 = (void *)((long)local_1c0 * local_1a0 * local_178.elemsize);
                        pvVar74 = (void *)0x0;
                        do {
                          local_1c8 = pvVar74;
                          if (iVar80 < 1) {
                            iVar60 = 0;
                          }
                          else {
                            uVar62 = 0;
                            iVar60 = 0;
                            piVar67 = local_1b8;
                            do {
                              if (0 < (int)uVar72) {
                                uVar66 = 0;
                                do {
                                  iVar60 = iVar60 + (int)*(char *)((long)piVar67 + uVar66) *
                                                    (int)*(char *)((long)local_178.data +
                                                                  (long)*(int *)(local_128._0_8_ +
                                                                                uVar66 * 4) +
                                                                  local_178.cstep *
                                                                  local_178.elemsize * uVar62 +
                                                                  (long)local_178.w *
                                                                  (long)local_1b0 +
                                                                  (long)local_1c8 * lVar70);
                                  uVar66 = uVar66 + 1;
                                } while (uVar72 != uVar66);
                              }
                              piVar67 = (pointer)((long)local_1d0 + (long)piVar67);
                              uVar62 = uVar62 + 1;
                            } while (uVar62 != uVar83);
                          }
                          *(int *)((long)local_1e8 + (long)local_1c8 * 4) = iVar60;
                          pvVar74 = (void *)((long)local_1c8 + 1U);
                        } while ((void *)((long)local_1c8 + 1U) != pvVar85);
                      }
                      local_1e8 = (void *)((long)local_1e8 + (long)pvVar85 * 4);
                      local_1c0 = (Mat *)((long)&local_1c0->data + 1);
                      puVar73 = local_198;
                    } while (local_1c0 != (Mat *)local_198);
                  }
                  local_188 = local_188 + 1;
                } while ((Mat *)local_188 != local_190);
              }
              goto LAB_001b407d;
            }
            local_e8 = 0;
            local_128._0_8_ = (pointer)0x0;
            local_128._8_4_ = 0;
            local_128._12_4_ = 0;
            local_128._16_8_ = (Allocator *)0x0;
            local_128._24_4_ = 0;
            local_128._32_8_ = (Allocator *)0x0;
            local_128._40_4_ = 0;
            local_128._44_4_ = 0;
            local_128._48_12_ = SUB1612((undefined1  [16])0x0,4);
            Mat::create((Mat *)local_128,local_d8.h * local_d8.w,uVar72,local_178.c,1,1,
                        local_180->workspace_allocator);
            local_190 = &local_1a8->weight_sgemm_data;
            if (0 < iVar80) {
              iVar80 = (int)local_1d8 * (int)local_1a0;
              local_1a0 = 0;
              do {
                if (0 < (int)local_1b0) {
                  local_1b8 = (pointer)((long)local_178.data +
                                       local_178.cstep * local_1a0 * local_178.elemsize);
                  piVar67 = (pointer)(local_128._0_8_ + local_e8 * local_1a0 * local_128._16_8_);
                  local_1c0 = (Mat *)((long)local_178.w * local_178.elemsize * local_188);
                  pvVar85 = (void *)0x0;
                  do {
                    local_1d8 = pvVar85;
                    if (0 < (int)uVar71) {
                      local_1d0 = (pointer)((long)local_1b8 + (long)local_1c0 * (long)local_1d8);
                      pvVar85 = (void *)0x0;
                      do {
                        if (0 < (int)puVar73) {
                          piVar69 = (pointer)((long)local_1d0 + (long)pvVar85 * (long)iVar60);
                          iVar86 = 0;
                          do {
                            if (iVar82 < 4) {
                              uVar72 = 0;
                            }
                            else {
                              iVar61 = 3;
                              do {
                                *(char *)piVar67 = (char)*piVar69;
                                *(undefined1 *)((long)piVar67 + 1) =
                                     *(undefined1 *)((long)piVar69 + lVar70);
                                *(undefined1 *)((long)piVar67 + 2) =
                                     *(undefined1 *)((long)piVar69 + (long)(iVar63 * 2));
                                *(undefined1 *)((long)piVar67 + 3) =
                                     *(undefined1 *)((long)piVar69 + (long)(iVar63 * 3));
                                piVar69 = piVar69 + lVar70;
                                piVar67 = piVar67 + 1;
                                iVar61 = iVar61 + 4;
                                uVar72 = iVar82 & 0xfffffffc;
                              } while (iVar61 < iVar82);
                            }
                            uVar59 = uVar72 | 1;
                            while ((int)uVar59 < iVar82) {
                              *(char *)piVar67 = (char)*piVar69;
                              *(undefined1 *)((long)piVar67 + 1) =
                                   *(undefined1 *)((long)piVar69 + lVar70);
                              piVar69 = (pointer)((long)piVar69 + (long)(iVar63 * 2));
                              piVar67 = (pointer)((long)piVar67 + 2);
                              uVar59 = uVar72 + 3;
                              uVar72 = uVar72 + 2;
                            }
                            if ((int)uVar72 < iVar82) {
                              iVar61 = iVar82 - uVar72;
                              do {
                                *(char *)piVar67 = (char)*piVar69;
                                piVar69 = (pointer)((long)piVar69 + lVar70);
                                piVar67 = (pointer)((long)piVar67 + 1);
                                iVar61 = iVar61 + -1;
                              } while (iVar61 != 0);
                            }
                            piVar69 = (pointer)((long)piVar69 + (long)(iVar80 - iVar82 * iVar63));
                            iVar86 = iVar86 + 1;
                            puVar73 = local_198;
                          } while (iVar86 != (int)local_198);
                        }
                        pvVar85 = (void *)((long)pvVar85 + 1);
                      } while (pvVar85 != pvVar74);
                    }
                    pvVar85 = (void *)((long)local_1d8 + 1U);
                  } while ((void *)((long)local_1d8 + 1U) != local_1b0);
                }
                local_1a0 = local_1a0 + 1;
                local_1c8 = pvVar74;
              } while (local_1a0 != uVar83);
            }
            im2col_sgemm_int8_sse((Mat *)local_128,&local_d8,local_190,local_180);
            piVar33 = (int *)CONCAT44(local_128._12_4_,local_128._8_4_);
            if (piVar33 != (int *)0x0) {
              LOCK();
              *piVar33 = *piVar33 + -1;
              UNLOCK();
              if (*piVar33 == 0) {
                if ((Allocator *)local_128._32_8_ == (Allocator *)0x0) goto LAB_001b4204;
                (*(*(_func_int ***)local_128._32_8_)[3])();
              }
            }
          }
        }
      }
    }
LAB_001b4092:
    p_Var31 = local_1a8->_vptr_Convolution_x86[-3];
    if (local_7c < 0x65) {
      dequantize_from_int32
                (&local_d8,local_88,&local_1a8->scale_in_data,
                 (Mat *)(p_Var31 + 0x18 + (long)&(local_1a8->scale_in_data).data),local_180);
      pLVar32 = local_1a8->activation;
      iVar60 = 0;
      if (pLVar32 != (Layer *)0x0) {
        (*pLVar32->_vptr_Layer[9])(pLVar32,local_88,local_180);
      }
    }
    else {
      iVar60 = 0;
      requantize_from_int32_to_int8
                (&local_d8,local_88,&local_1a8->scale_in_data,
                 (Mat *)(&local_1a8->field_0x280 + (long)p_Var31),
                 (Mat *)(p_Var31 + 0x18 + (long)&(local_1a8->scale_in_data).data),
                 *(int *)(p_Var31 + 0x1c + (long)&(local_1a8->weight_winograd43_data).data),
                 (Mat *)(p_Var31 + 0x20 + (long)&(local_1a8->weight_winograd43_data).data),local_180
                );
    }
  }
  piVar33 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
  if (piVar33 != (int *)0x0) {
    LOCK();
    *piVar33 = *piVar33 + -1;
    UNLOCK();
    if (*piVar33 == 0) {
      if (local_d8.allocator == (Allocator *)0x0) {
        if (local_d8.data != (void *)0x0) {
          free(local_d8.data);
        }
      }
      else {
        (*(local_d8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_001b4178:
  piVar33 = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
  if (piVar33 != (int *)0x0) {
    LOCK();
    *piVar33 = *piVar33 + -1;
    UNLOCK();
    if (*piVar33 == 0) {
      if (local_178.allocator == (Allocator *)0x0) {
        if (local_178.data != (void *)0x0) {
          free(local_178.data);
        }
      }
      else {
        (*(local_178.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  if (local_78.refcount != (int *)0x0) {
    LOCK();
    *local_78.refcount = *local_78.refcount + -1;
    UNLOCK();
    if (*local_78.refcount == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if (local_78.data != (void *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar60;
}

Assistant:

int Convolution_x86::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int elembits = bottom_blob.elembits();

    Mat bottom_blob_int8 = bottom_blob;
    if (elembits != 8)
    {
        Option opt_q = opt;
        opt_q.blob_allocator = opt.workspace_allocator;
        quantize_to_int8(bottom_blob, bottom_blob_int8, bottom_blob_int8_scales, opt_q);
    }

    //     NCNN_LOGE("Convolution_arm input %d x %d  ksize=%d %d  stride=%d %d", w, h, kernel_w, kernel_h, stride_w, stride_h);

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_int8, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    int w = bottom_blob_bordered.w;
    int h = bottom_blob_bordered.h;
    int channels = bottom_blob_bordered.c;
    int elempack = bottom_blob_bordered.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    bool use_int8_requantize = int8_scale_term > 100;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        if (use_int8_requantize)
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        else
            out_elempack = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__
    size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

    //     NCNN_LOGE("forward_int8_arm %d %d %d    %d %d", w, h, bottom_blob_bordered.c, elempack, out_elempack);

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    const int num_input = channels * elempack;

    int out_elempack_int32 = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        out_elempack_int32 = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__

    Mat top_blob_int32;
    top_blob_int32.create(outw, outh, num_output / out_elempack_int32, (size_t)(4u * out_elempack_int32), out_elempack_int32, opt.workspace_allocator);
    if (top_blob_int32.empty())
        return -100;

#if __SSE2__
    if (elempack == 8 && out_elempack_int32 == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv1x1s1_sgemm_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv1x1s2_sgemm_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd43_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_winograd43_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_winograd43_data, opt);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
        else
        {
            convolution_pack8to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_tm, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
    }

    if (elempack == 1 && out_elempack_int32 == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv1x1s1_sgemm_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv1x1s2_sgemm_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv3x3s2_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 7 && kernel_h == 7 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv7x7s2_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (opt.use_sgemm_convolution) // TODO better condition && num_input >= 8 && num_output >= 8)
        {
            convolution_im2col_sgemm_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
        else
        {
            convolution_pack1to4_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_tm, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
    }

    if (elempack == 8 && out_elempack_int32 == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv1x1s1_sgemm_pack8to1_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv1x1s2_sgemm_pack8to1_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd43_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_winograd43_pack8to1_int8_sse(bottom_blob_bordered, top_blob_int32, weight_winograd43_data, opt);
        }
        else if (opt.use_sgemm_convolution) // TODO better condition && num_input >= 8 && num_output >= 8)
        {
            convolution_im2col_sgemm_pack8to1_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
        else
        {
            convolution_pack8to1_int8_sse(bottom_blob_bordered, top_blob_int32, weight_data_tm, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
    }
#endif // __SSE2__

    if (elempack == 1 && out_elempack_int32 == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv1x1s1_sgemm_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            conv1x1s2_sgemm_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, opt);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd23_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && num_input >= 16 && num_output >= 16)
        {
            conv3x3s1_winograd23_int8_sse(bottom_blob_bordered, top_blob_int32, weight_winograd23_data, opt);
            // conv3x3s1_winograd43_int8_sse(bottom_blob_bordered, top_blob_int32, weight_winograd43_data, opt);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_int8_sse(bottom_blob_bordered, top_blob_int32, weight_sgemm_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
        else
        {
            convolution_int8(bottom_blob_bordered, top_blob_int32, weight_data_tm, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, opt);
        }
    }

    if (use_int8_requantize)
    {
        requantize_from_int32_to_int8(top_blob_int32, top_blob, scale_in_data, top_blob_int8_scales, bias_data, activation_type, activation_params, opt);
    }
    else
    {
        dequantize_from_int32(top_blob_int32, top_blob, scale_in_data, bias_data, opt);

        if (activation)
        {
            activation->forward_inplace(top_blob, opt);
        }
    }

    return 0;
}